

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetFrameworkFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *l,string *config,
          cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  pointer pcVar1;
  string *config_00;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  long *plVar4;
  char *pcVar5;
  cmComputeLinkInformation *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  size_type *psVar7;
  pointer pbVar8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string frameworkDir;
  string fwSearchFlagVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_100;
  string *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  cmGeneratorTarget *local_d0;
  string local_c8;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  char *local_60;
  cmLocalGenerator *local_58;
  string local_50;
  
  local_d0 = target;
  local_58 = cmGeneratorTarget::GetLocalGenerator(target);
  this_00 = local_58->Makefile;
  pcVar1 = local_a8 + 0x10;
  local_a8._16_6_ = 0x454c505041;
  local_a8._8_8_ = 5;
  local_a8._0_8_ = pcVar1;
  bVar3 = cmMakefile::IsOn(this_00,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if (bVar3) {
    local_e0 = config;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "CMAKE_",l);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_a8);
    config_00 = local_e0;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_c8.field_2._M_allocated_capacity = *psVar7;
      local_c8.field_2._8_8_ = plVar4[3];
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar7;
      local_c8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_c8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    pcVar5 = cmMakefile::GetDefinition(this_00,&local_c8);
    pcVar2 = local_58;
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      local_a8._24_8_ = local_a8 + 8;
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
      local_a8._16_8_ = 0;
      local_80 = 0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_100.field_2._M_allocated_capacity._0_2_ = 0x43;
      local_100._M_string_length = 1;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_88 = (_Base_ptr)local_a8._24_8_;
      GetIncludeDirectories(local_58,&local_78,local_d0,&local_100,config_00,true);
      local_60 = pcVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT62(local_100.field_2._M_allocated_capacity._2_6_,
                                 local_100.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if (local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar8 = local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar3 = cmGlobalGenerator::NameResolvesToFramework(pcVar2->GlobalGenerator,pbVar8);
          if (bVar3) {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            pcVar1 = (pbVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,pcVar1,pcVar1 + pbVar8->_M_string_length);
            std::__cxx11::string::append((char *)&local_100);
            cmsys::SystemTools::CollapseFullPath(&local_50,&local_100);
            std::__cxx11::string::operator=((string *)&local_100,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_a8,&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              CONCAT62(local_100.field_2._M_allocated_capacity._2_6_,
                                       local_100.field_2._M_allocated_capacity._0_2_) + 1);
            }
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_d8 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d8;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      this_01 = cmGeneratorTarget::GetLinkInformation(local_d0,local_e0);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        pvVar6 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(this_01);
        pbVar8 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar8 != (pvVar6->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          do {
            pVar9 = std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_a8,pbVar8);
            if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              cmOutputConverter::ConvertToOutputFormat
                        (&local_100,&pcVar2->super_cmOutputConverter,pbVar8,SHELL);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_100._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                CONCAT62(local_100.field_2._M_allocated_capacity._2_6_,
                                         local_100.field_2._M_allocated_capacity._0_2_) + 1);
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != (pvVar6->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetFrameworkFlags(std::string const& l,
                                                std::string const& config,
                                                cmGeneratorTarget* target)
{
  return ::GetFrameworkFlags(l, config, target);
}